

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O3

void av1_find_cnn_output_size
               (int in_width,int in_height,CNN_CONFIG *cnn_config,int *out_width,int *out_height,
               int *out_channels)

{
  BRANCH_COPY BVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  CNN_LAYER_CONFIG *pCVar7;
  int c;
  ulong uVar8;
  long lVar9;
  CNN_LAYER_CONFIG *layer_config;
  long lVar10;
  int o_height;
  int o_width;
  int channels_per_branch [4];
  int i_height [4];
  int i_width [4];
  int local_94;
  int local_90;
  int local_8c;
  int local_88 [4];
  ulong local_78;
  undefined8 uStack_70;
  ulong local_68 [3];
  CNN_CONFIG *local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  local_38 = out_channels;
  local_40 = out_height;
  local_48 = out_width;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_68[1] = 0;
  uStack_70 = 0;
  local_68[0] = (ulong)(uint)(in_width + cnn_config->ext_width * 2);
  local_78 = (ulong)(uint)(in_height + cnn_config->ext_height * 2);
  local_50 = cnn_config;
  local_94 = cnn_config->num_layers;
  if (0 < local_94) {
    lVar10 = 0;
    do {
      uVar2 = cnn_config->layer_config[lVar10].branch;
      lVar9 = (long)(int)uVar2;
      local_8c = 0;
      local_90 = 0;
      BVar1 = cnn_config->layer_config[lVar10].branch_copy_type;
      uVar3 = cnn_config->layer_config[lVar10].branch_config.input_to_branches;
      if (BVar1 == '\x01') {
        uVar4 = 0;
        do {
          if (uVar2 != uVar4 && (uVar3 >> ((uint)uVar4 & 0x1f) & 1) != 0) {
            *(undefined4 *)((long)local_68 + uVar4 * 4) =
                 *(undefined4 *)((long)local_68 + lVar9 * 4);
            *(undefined4 *)((long)&local_78 + uVar4 * 4) =
                 *(undefined4 *)((long)&local_78 + lVar9 * 4);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != 4);
      }
      layer_config = cnn_config->layer_config + lVar10;
      av1_find_cnn_layer_output_size
                (*(int *)((long)local_68 + lVar9 * 4),*(int *)((long)&local_78 + lVar9 * 4),
                 layer_config,&local_8c,&local_90);
      *(int *)((long)local_68 + lVar9 * 4) = local_8c;
      *(int *)((long)&local_78 + lVar9 * 4) = local_90;
      uVar4 = (ulong)uVar2;
      if (BVar1 == '\x02') {
        uVar6 = 0;
        do {
          if (((uVar3 >> ((uint)uVar6 & 0x1f) & 1) != 0) && (uVar4 != uVar6)) {
            *(int *)((long)local_68 + uVar6 * 4) = local_8c;
            *(int *)((long)&local_78 + uVar6 * 4) = local_90;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != 4);
      }
      uVar6 = 0;
      do {
        if (((uVar3 >> ((uint)uVar6 & 0x1f) & 1) != 0) && (uVar6 != uVar4)) {
          pCVar7 = layer_config;
          if (BVar1 == '\x01') {
LAB_003b733a:
            local_88[uVar6] = pCVar7->in_channels;
          }
          else if (BVar1 == '\x03') {
            iVar5 = layer_config->out_channels;
            local_88[uVar6] = iVar5;
            uVar2 = (layer_config->branch_config).branches_to_combine;
            uVar8 = 0;
            do {
              if (((uVar2 >> ((uint)uVar8 & 0x1f) & 1) != 0) && (uVar4 != uVar8)) {
                iVar5 = iVar5 + local_88[uVar8];
                local_88[uVar6] = iVar5;
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 != 4);
          }
          else {
            pCVar7 = (CNN_LAYER_CONFIG *)&layer_config->out_channels;
            if (BVar1 == '\x02') goto LAB_003b733a;
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != 4);
      iVar5 = layer_config->out_channels;
      local_88[lVar9] = iVar5;
      uVar2 = (layer_config->branch_config).branches_to_combine;
      uVar6 = 0;
      do {
        if (((uVar2 >> ((uint)uVar6 & 0x1f) & 1) != 0) && (uVar4 != uVar6)) {
          iVar5 = iVar5 + local_88[uVar6];
          local_88[lVar9] = iVar5;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != 4);
      lVar9 = (long)layer_config->output_num;
      if (lVar9 != -1) {
        local_48[lVar9] = local_8c;
        local_40[lVar9] = local_90;
        local_38[lVar9] = local_88[layer_config->branch];
        local_94 = local_50->num_layers;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < local_94);
  }
  return;
}

Assistant:

void av1_find_cnn_output_size(int in_width, int in_height,
                              const CNN_CONFIG *cnn_config, int *out_width,
                              int *out_height, int *out_channels) {
  int channels_per_branch[CNN_MAX_BRANCHES] = { 0 };
  int i_width[CNN_MAX_BRANCHES] = { 0 };
  int i_height[CNN_MAX_BRANCHES] = { 0 };
  i_width[0] = in_width + cnn_config->ext_width * 2;
  i_height[0] = in_height + cnn_config->ext_height * 2;

#if CONFIG_DEBUG
  assert(cnn_has_at_least_one_output(cnn_config));
#endif

  for (int i = 0; i < cnn_config->num_layers; ++i) {
    const CNN_LAYER_CONFIG *layer_config = &cnn_config->layer_config[i];
    const CNN_BRANCH_CONFIG *branch_config = &layer_config->branch_config;
    const int branch = layer_config->branch;
    int o_width = 0, o_height = 0;

    if (layer_config->branch_copy_type == BRANCH_INPUT) {
      for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
        if ((branch_config->input_to_branches & (1 << b)) && b != branch) {
          assert(i_width[branch] > 0 && i_height[branch] > 0);
          i_width[b] = i_width[branch];
          i_height[b] = i_height[branch];
        }
      }
    }

    av1_find_cnn_layer_output_size(i_width[branch], i_height[branch],
                                   layer_config, &o_width, &o_height);
    i_width[branch] = o_width;
    i_height[branch] = o_height;

    if (layer_config->branch_copy_type == BRANCH_OUTPUT) {
      for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
        if ((branch_config->input_to_branches & (1 << b)) && b != branch) {
          i_width[b] = o_width;
          i_height[b] = o_height;
        }
      }
    }

    find_cnn_out_channels(layer_config, channels_per_branch);

    const int output_num = layer_config->output_num;
    if (output_num != -1) {  // Current layer is an output layer
      out_width[output_num] = o_width;
      out_height[output_num] = o_height;
      out_channels[output_num] = channels_per_branch[layer_config->branch];
    }
  }
}